

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_quantize_intrin_avx2.c
# Opt level: O2

void aom_highbd_quantize_b_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  undefined8 *puVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  long lVar11;
  __m256i alVar12;
  __m256i alVar13;
  undefined1 auVar14 [32];
  __m256i tmp_rnd;
  __m256i qp [5];
  undefined1 local_220 [32];
  undefined1 local_1d0 [16];
  __m256i local_1c0;
  __m256i local_1a0;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  longlong local_140;
  longlong lStack_138;
  longlong lStack_130;
  longlong lStack_128;
  __m256i local_120;
  longlong local_100;
  longlong lStack_f8;
  longlong lStack_f0;
  longlong lStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  longlong local_c0 [4];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  longlong local_80 [10];
  
  init_qp(zbin_ptr,round_ptr,quant_ptr,dequant_ptr,quant_shift_ptr,(__m256i *)&local_100,0);
  auVar2 = *(undefined1 (*) [32])coeff_ptr;
  auVar5 = vpabsd_avx2(auVar2);
  auVar6._8_8_ = lStack_f8;
  auVar6._0_8_ = local_100;
  auVar6._16_8_ = lStack_f0;
  auVar6._24_8_ = lStack_e8;
  auVar6 = vpcmpgtd_avx2(auVar5,auVar6);
  if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar6 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar6 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar6 >> 0x7f,0) == '\0') &&
        (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar6 >> 0xbf,0) == '\0') &&
      (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar6[0x1f]) {
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    qcoeff_ptr[4] = 0;
    qcoeff_ptr[5] = 0;
    qcoeff_ptr[6] = 0;
    qcoeff_ptr[7] = 0;
    local_220 = ZEXT1632(ZEXT816(0));
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
    dqcoeff_ptr[4] = 0;
    dqcoeff_ptr[5] = 0;
    dqcoeff_ptr[6] = 0;
    dqcoeff_ptr[7] = 0;
    local_1d0 = (undefined1  [16])0x0;
  }
  else {
    auVar7._8_8_ = uStack_d8;
    auVar7._0_8_ = local_e0;
    auVar7._16_8_ = uStack_d0;
    auVar7._24_8_ = uStack_c8;
    auVar5 = vpaddd_avx2(auVar5,auVar7);
    alVar13 = (__m256i)vpand_avx2(auVar6,auVar5);
    alVar12 = alVar13;
    local_1a0 = alVar13;
    mm256_mul_shift_epi32(&local_1a0,&local_c0);
    alVar13 = (__m256i)vpaddd_avx2((undefined1  [32])alVar12,(undefined1  [32])alVar13);
    local_1c0 = alVar13;
    mm256_mul_shift_epi32(&local_1c0,(__m256i *)local_80);
    auVar5._8_8_ = uStack_98;
    auVar5._0_8_ = local_a0;
    auVar5._16_8_ = uStack_90;
    auVar5._24_8_ = uStack_88;
    auVar6 = vpmulld_avx2((undefined1  [32])alVar13,auVar5);
    auVar5 = vpcmpgtd_avx2((undefined1  [32])alVar13,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar7 = vpsignd_avx2((undefined1  [32])alVar13,auVar2);
    auVar2 = vpsignd_avx2(auVar6,auVar2);
    *(undefined1 (*) [32])qcoeff_ptr = auVar7;
    *(undefined1 (*) [32])dqcoeff_ptr = auVar2;
    auVar2 = vpackssdw_avx2(auVar5,auVar5);
    auVar5 = vpermq_avx2(auVar2,0xd8);
    auVar2 = vpsubw_avx2(ZEXT1632(*(undefined1 (*) [16])iscan),auVar5);
    auVar2 = vpand_avx2(auVar2,auVar5);
    local_220 = vpmaxsw_avx2(auVar2,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
  }
  update_qp((__m256i *)&local_100);
  local_140 = local_100;
  lStack_138 = lStack_f8;
  lStack_130 = lStack_f0;
  lStack_128 = lStack_e8;
  local_160 = local_e0;
  uStack_158 = uStack_d8;
  uStack_150 = uStack_d0;
  uStack_148 = uStack_c8;
  local_180 = local_a0;
  uStack_178 = uStack_98;
  uStack_170 = uStack_90;
  uStack_168 = uStack_88;
  do {
    lVar11 = 0;
    while( true ) {
      iscan = (int16_t *)((long)iscan + 0x10);
      if (n_coeffs < 9) {
        auVar3 = vpshufd_avx(local_220._0_16_,0xe);
        auVar3 = vpmaxsw_avx(local_220._0_16_,auVar3);
        auVar4 = vpshuflw_avx(auVar3,0xe);
        auVar3 = vpmaxsw_avx(auVar3,auVar4);
        auVar4 = vpshuflw_avx(auVar3,1);
        auVar3 = vpmaxsw_avx(auVar3,auVar4);
        vpextrw_avx(auVar3,0);
        return;
      }
      auVar2 = *(undefined1 (*) [32])((long)coeff_ptr + lVar11 + 0x20);
      auVar5 = vpabsd_avx2(auVar2);
      auVar10._8_8_ = lStack_138;
      auVar10._0_8_ = local_140;
      auVar10._16_8_ = lStack_130;
      auVar10._24_8_ = lStack_128;
      auVar6 = vpcmpgtd_avx2(auVar5,auVar10);
      if ((((((((auVar6 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar6 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar6 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar6 >> 0x7f,0) != '\0') ||
            (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar6 >> 0xbf,0) != '\0') ||
          (auVar6 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar6[0x1f] < '\0')
      break;
      puVar1 = (undefined8 *)(*(undefined1 (*) [32])((long)qcoeff_ptr + 0x20) + lVar11);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[2] = 0;
      puVar1[3] = 0;
      puVar1 = (undefined8 *)(*(undefined1 (*) [32])((long)dqcoeff_ptr + 0x20) + lVar11);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[2] = 0;
      puVar1[3] = 0;
      lVar11 = lVar11 + 0x20;
      n_coeffs = n_coeffs + -8;
    }
    auVar9._8_8_ = uStack_158;
    auVar9._0_8_ = local_160;
    auVar9._16_8_ = uStack_150;
    auVar9._24_8_ = uStack_148;
    auVar5 = vpaddd_avx2(auVar5,auVar9);
    alVar13 = (__m256i)vpand_avx2(auVar6,auVar5);
    local_1a0 = alVar13;
    local_120 = alVar13;
    mm256_mul_shift_epi32(&local_1a0,&local_c0);
    alVar13 = (__m256i)vpaddd_avx2((undefined1  [32])alVar13,(undefined1  [32])local_120);
    local_1c0 = alVar13;
    mm256_mul_shift_epi32(&local_1c0,(__m256i *)local_80);
    auVar8._8_8_ = uStack_178;
    auVar8._0_8_ = local_180;
    auVar8._16_8_ = uStack_170;
    auVar8._24_8_ = uStack_168;
    auVar6 = vpmulld_avx2((undefined1  [32])alVar13,auVar8);
    auVar5 = vpcmpgtd_avx2((undefined1  [32])alVar13,_DAT_0046a360);
    auVar7 = vpsignd_avx2((undefined1  [32])alVar13,auVar2);
    auVar2 = vpsignd_avx2(auVar6,auVar2);
    qcoeff_ptr = (tran_low_t *)(*(undefined1 (*) [32])((long)qcoeff_ptr + 0x20) + lVar11);
    *(undefined1 (*) [32])qcoeff_ptr = auVar7;
    dqcoeff_ptr = (tran_low_t *)(*(undefined1 (*) [32])((long)dqcoeff_ptr + 0x20) + lVar11);
    *(undefined1 (*) [32])dqcoeff_ptr = auVar2;
    auVar2 = vpackssdw_avx2(auVar5,auVar5);
    auVar14._0_16_ = ZEXT116(0) * local_1d0 + ZEXT116(1) * *(undefined1 (*) [16])iscan;
    auVar14._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * local_1d0;
    auVar5 = vpermq_avx2(auVar2,0xd8);
    auVar2 = vpsubw_avx2(auVar14,auVar5);
    auVar2 = vpand_avx2(auVar2,auVar5);
    local_220 = vpmaxsw_avx2(local_220,auVar2);
    n_coeffs = n_coeffs + -8;
    coeff_ptr = (tran_low_t *)((long)coeff_ptr + lVar11 + 0x20);
  } while( true );
}

Assistant:

void aom_highbd_quantize_b_avx2(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                                const int16_t *zbin_ptr,
                                const int16_t *round_ptr,
                                const int16_t *quant_ptr,
                                const int16_t *quant_shift_ptr,
                                tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                                const int16_t *dequant_ptr, uint16_t *eob_ptr,
                                const int16_t *scan, const int16_t *iscan) {
  (void)scan;
  const int step = 8;

  __m256i eob = _mm256_setzero_si256();
  __m256i qp[5];

  init_qp(zbin_ptr, round_ptr, quant_ptr, dequant_ptr, quant_shift_ptr, qp, 0);

  quantize(qp, coeff_ptr, iscan, qcoeff_ptr, dqcoeff_ptr, &eob);

  coeff_ptr += step;
  qcoeff_ptr += step;
  dqcoeff_ptr += step;
  iscan += step;
  n_coeffs -= step;

  update_qp(qp);

  while (n_coeffs > 0) {
    quantize(qp, coeff_ptr, iscan, qcoeff_ptr, dqcoeff_ptr, &eob);

    coeff_ptr += step;
    qcoeff_ptr += step;
    dqcoeff_ptr += step;
    iscan += step;
    n_coeffs -= step;
  }

  *eob_ptr = get_max_eob(eob);
}